

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O3

wchar_t archive_read_format_cab_read_header(archive_read *a,archive_entry *entry)

{
  char cVar1;
  char cVar2;
  ushort uVar3;
  short sVar4;
  ushort uVar5;
  undefined8 *puVar6;
  void *pvVar7;
  ushort uVar8;
  wchar_t wVar9;
  wchar_t wVar10;
  uint uVar11;
  uchar *p;
  char *pcVar12;
  archive_string_conv *sc;
  int *piVar13;
  wchar_t *pwVar14;
  size_t n;
  void *pvVar15;
  uint *puVar16;
  time_t tVar17;
  long lVar18;
  ulong uVar19;
  bool bVar20;
  uint uVar21;
  char *pcVar22;
  char *p_00;
  int iVar23;
  mode_t m;
  char *pcVar24;
  ulong uVar25;
  long lVar26;
  uint uVar27;
  uint uVar28;
  uchar *p_1;
  long lVar29;
  uint *puVar30;
  char *pcVar31;
  size_t sVar32;
  long lVar33;
  long local_38;
  
  puVar6 = (undefined8 *)a->format->data;
  wVar9 = L'\0';
  if (*(char *)(puVar6 + 0x12) != '\0') {
LAB_00118615:
    iVar23 = *(int *)(puVar6 + 0xe);
    if ((int)(uint)*(ushort *)((long)puVar6 + 0x52) <= iVar23) {
      *(undefined1 *)((long)puVar6 + 0x91) = 1;
      return L'\x01';
    }
    lVar29 = puVar6[5];
    *(int *)(puVar6 + 0xe) = iVar23 + 1;
    puVar16 = (uint *)(puVar6[0xd] + (long)iVar23 * 0x30);
    *(undefined2 *)((long)puVar6 + 0x92) = 0;
    puVar6[2] = 0;
    puVar6[3] = 0;
    puVar6[4] = 0;
    puVar6[6] = puVar16;
    uVar3 = *(ushort *)(puVar6[0xd] + 0x10 + (long)iVar23 * 0x30);
    if (uVar3 == 0xffff) {
LAB_00118680:
      lVar18 = puVar6[0xc];
    }
    else if (uVar3 == 0xfffe) {
      lVar18 = puVar6[0xc] + (ulong)((uint)*(ushort *)(puVar6 + 10) * 0x60) + -0x60;
    }
    else {
      if (uVar3 == 0xfffd) goto LAB_00118680;
      lVar18 = (ulong)((uint)uVar3 * 0x60) + puVar6[0xc];
    }
    puVar6[5] = lVar18;
    if (lVar29 != lVar18) {
      puVar6[7] = 0;
    }
    if (*(char *)((long)puVar16 + 0x12) < '\0') {
      sc = (archive_string_conv *)puVar6[0x19];
      if (sc == (archive_string_conv *)0x0) {
        sc = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
        puVar6[0x19] = sc;
        if (sc == (archive_string_conv *)0x0) {
          return L'\xffffffe2';
        }
      }
    }
    else {
      sc = (archive_string_conv *)puVar6[0x17];
      if (sc == (archive_string_conv *)0x0) {
        if (*(int *)(puVar6 + 0x16) == 0) {
          sc = archive_string_default_conversion_for_read(&a->archive);
          puVar6[0x18] = sc;
          *(undefined4 *)(puVar6 + 0x16) = 1;
        }
        else {
          sc = (archive_string_conv *)puVar6[0x18];
        }
      }
    }
    uVar25 = *(ulong *)(puVar16 + 8);
    bVar20 = false;
    if (uVar25 == 0) {
      uVar25 = 0;
      sVar32 = 0;
    }
    else {
      cVar1 = *(char *)((long)puVar16 + 0x12);
      sVar32 = 0;
      do {
        cVar2 = *(char *)(*(long *)(puVar16 + 6) + sVar32);
        if (cVar2 == '\\') {
          if (bVar20) break;
          *(undefined1 *)(*(long *)(puVar16 + 6) + sVar32) = 0x2f;
          uVar25 = *(ulong *)(puVar16 + 8);
          bVar20 = false;
        }
        else {
          bVar20 = cVar2 < '\0' && -1 < cVar1;
        }
        sVar32 = sVar32 + 1;
      } while (sVar32 < uVar25);
    }
    wVar10 = _archive_entry_copy_pathname_l(entry,*(char **)(puVar16 + 6),uVar25,sc);
    if (wVar10 == L'\0') {
LAB_001188e4:
      if ((sVar32 != uVar25) &&
         (pwVar14 = archive_entry_pathname_w(entry), pwVar14 != (wchar_t *)0x0)) {
        puVar6[0x10] = 0;
        n = wcslen(pwVar14);
        archive_wstrncat((archive_wstring *)(puVar6 + 0xf),pwVar14,n);
        pwVar14 = (wchar_t *)puVar6[0xf];
        lVar29 = puVar6[0x10];
        if (lVar29 != 0) {
          lVar18 = 0;
          do {
            if (pwVar14[lVar18] == L'\\') {
              pwVar14[lVar18] = L'/';
            }
            lVar18 = lVar18 + 1;
          } while (lVar29 != lVar18);
        }
        archive_entry_copy_pathname_w(entry,pwVar14);
      }
      archive_entry_set_size(entry,(ulong)*puVar16);
      m = 0x816d;
      if ((*(byte *)((long)puVar16 + 0x12) & 1) == 0) {
        m = 0x81b6;
      }
      archive_entry_set_mode(entry,m);
      archive_entry_set_mtime(entry,*(time_t *)(puVar16 + 2),0);
      uVar11 = *puVar16;
      puVar6[1] = (ulong)uVar11;
      *puVar6 = 0;
      if ((ulong)uVar11 == 0) {
        *(undefined2 *)((long)puVar6 + 0x92) = 0x101;
      }
      snprintf((char *)(puVar6 + 0x1a),0x40,"CAB %d.%d (%s)",(ulong)*(byte *)((long)puVar6 + 0x5a),
               (ulong)*(byte *)((long)puVar6 + 0x5b),*(undefined8 *)(puVar6[5] + 0x10));
      (a->archive).archive_format_name = (char *)(puVar6 + 0x1a);
      return wVar9;
    }
    piVar13 = __errno_location();
    if (*piVar13 != 0xc) {
      archive_string_conversion_charset_name(sc);
      archive_set_error(&a->archive,0x54,"Pathname cannot be converted from %s to current locale.");
      wVar9 = L'\xffffffec';
      goto LAB_001188e4;
    }
    pcVar22 = "Can\'t allocate memory for Pathname";
LAB_001188af:
    iVar23 = 0xc;
    goto LAB_00119041;
  }
  (a->archive).archive_format = 0xc0000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "CAB";
  }
  pcVar22 = (char *)__archive_read_ahead(a,0x2a,(ssize_t *)0x0);
  if (pcVar22 == (char *)0x0) goto LAB_00119032;
  pvVar7 = a->format->data;
  if (((*(char *)((long)pvVar7 + 0x90) == '\0') && (*pcVar22 == 'M')) && (pcVar22[1] == 'Z')) {
    uVar25 = 0x1000;
    do {
      while (pcVar22 = (char *)__archive_read_ahead(a,uVar25,&local_38), pcVar22 != (char *)0x0) {
        pcVar24 = pcVar22;
        if (8 < local_38) {
          pcVar31 = pcVar22 + local_38;
          p_00 = pcVar22;
          do {
            wVar9 = find_cab_magic(p_00);
            if (wVar9 == L'\0') {
              __archive_read_consume(a,(long)p_00 - (long)pcVar22);
              pcVar22 = (char *)__archive_read_ahead(a,0x2a,(ssize_t *)0x0);
              if (pcVar22 == (char *)0x0) goto LAB_00119032;
              goto LAB_00118a16;
            }
            pcVar24 = p_00 + (uint)wVar9;
            pcVar12 = p_00 + (ulong)(uint)wVar9 + 8;
            p_00 = pcVar24;
          } while (pcVar12 < pcVar31);
        }
        __archive_read_consume(a,(long)pcVar24 - (long)pcVar22);
      }
      bVar20 = 0xff < uVar25;
      uVar25 = uVar25 >> 1;
    } while (bVar20);
  }
  else {
LAB_00118a16:
    *(undefined8 *)((long)pvVar7 + 0x40) = 0;
    if (((*pcVar22 == 'M') && (pcVar22[1] == 'S')) && ((pcVar22[2] == 'C' && (pcVar22[3] == 'F'))))
    {
      *(undefined4 *)((long)pvVar7 + 0x48) = *(undefined4 *)(pcVar22 + 8);
      *(undefined4 *)((long)pvVar7 + 0x4c) = *(undefined4 *)(pcVar22 + 0x10);
      *(char *)((long)pvVar7 + 0x5b) = pcVar22[0x18];
      *(char *)((long)pvVar7 + 0x5a) = pcVar22[0x19];
      sVar4 = *(short *)(pcVar22 + 0x1a);
      *(short *)((long)pvVar7 + 0x50) = sVar4;
      if ((sVar4 == 0) ||
         (sVar4 = *(short *)(pcVar22 + 0x1c), *(short *)((long)pvVar7 + 0x52) = sVar4, sVar4 == 0))
      goto LAB_001190b1;
      uVar8 = *(ushort *)(pcVar22 + 0x1e);
      uVar3 = *(ushort *)(pcVar22 + 0x1e);
      *(ushort *)((long)pvVar7 + 0x54) = uVar3;
      *(undefined2 *)((long)pvVar7 + 0x56) = *(undefined2 *)(pcVar22 + 0x20);
      *(undefined2 *)((long)pvVar7 + 0x58) = *(undefined2 *)(pcVar22 + 0x22);
      if ((uVar8 & 4) == 0) {
        *(undefined1 *)((long)pvVar7 + 0x5c) = 0;
        lVar29 = 0x24;
      }
      else {
        uVar5 = *(ushort *)(pcVar22 + 0x24);
        if (60000 < uVar5) goto LAB_001190b1;
        *(char *)((long)pvVar7 + 0x5c) = pcVar22[0x26];
        *(char *)((long)pvVar7 + 0x5d) = pcVar22[0x27];
        lVar29 = (ulong)uVar5 + 0x28;
      }
      if ((uVar8 & 1) == 0) {
LAB_00118aeb:
        if ((uVar3 & 2) == 0) {
LAB_00118af7:
          __archive_read_consume(a,lVar29);
          *(long *)((long)pvVar7 + 0x40) = *(long *)((long)pvVar7 + 0x40) + lVar29;
          uVar3 = *(ushort *)((long)pvVar7 + 0x50);
          pvVar15 = calloc((ulong)uVar3,0x60);
          *(void **)((long)pvVar7 + 0x60) = pvVar15;
          if (pvVar15 != (void *)0x0) {
            lVar29 = 8;
            if ((*(byte *)((long)pvVar7 + 0x54) & 4) != 0) {
              lVar29 = (ulong)*(byte *)((long)pvVar7 + 0x5c) + 8;
            }
            uVar11 = 0;
            puVar16 = (uint *)__archive_read_ahead(a,lVar29 * (ulong)uVar3,(ssize_t *)0x0);
            if (puVar16 == (uint *)0x0) goto LAB_00119032;
            uVar3 = *(ushort *)((long)pvVar7 + 0x50);
            if (uVar3 == 0) {
              lVar29 = 0;
            }
            else {
              lVar18 = *(long *)((long)pvVar7 + 0x60);
              uVar8 = *(ushort *)((long)pvVar7 + 0x54);
              lVar26 = 0;
              lVar29 = 0;
              uVar27 = 0;
              do {
                uVar11 = *puVar16;
                *(uint *)(lVar18 + lVar26) = uVar11;
                *(short *)(lVar18 + 4 + lVar26) = (short)puVar16[1];
                uVar28 = *(byte *)((long)puVar16 + 6) & 0xf;
                *(short *)(lVar18 + 6 + lVar26) = (short)uVar28;
                *(ushort *)(lVar18 + 8 + lVar26) = (ushort)*(byte *)((long)puVar16 + 7);
                pcVar22 = "UNKNOWN";
                if ((byte)uVar28 < 4) {
                  pcVar22 = compression_name_rel +
                            *(int *)(compression_name_rel + (ulong)uVar28 * 4);
                }
                puVar16 = puVar16 + 2;
                lVar29 = lVar29 + 8;
                *(char **)(lVar18 + 0x10 + lVar26) = pcVar22;
                if ((uVar8 & 4) != 0) {
                  puVar16 = (uint *)((long)puVar16 + (ulong)*(byte *)((long)pvVar7 + 0x5c));
                  lVar29 = lVar29 + (ulong)*(byte *)((long)pvVar7 + 0x5c);
                }
                if (uVar11 <= uVar27) goto LAB_001190b1;
                *(undefined1 *)(lVar18 + 0x5c + lVar26) = 0;
                lVar26 = lVar26 + 0x60;
                uVar27 = uVar11;
              } while ((ulong)uVar3 * 0x60 != lVar26);
            }
            __archive_read_consume(a,lVar29);
            lVar29 = lVar29 + *(long *)((long)pvVar7 + 0x40);
            *(long *)((long)pvVar7 + 0x40) = lVar29;
            lVar18 = (ulong)*(uint *)((long)pvVar7 + 0x4c) - lVar29;
            if (lVar18 < 0) {
              archive_set_error(&a->archive,-1,"Invalid offset of CFFILE %jd < %jd",
                                (ulong)*(uint *)((long)pvVar7 + 0x4c),lVar29);
              return L'\xffffffe2';
            }
            if (lVar18 != 0) {
              __archive_read_consume(a,lVar18);
              *(long *)((long)pvVar7 + 0x40) = *(long *)((long)pvVar7 + 0x40) + lVar18;
            }
            uVar3 = *(ushort *)((long)pvVar7 + 0x52);
            pvVar15 = calloc((ulong)uVar3,0x30);
            *(void **)((long)pvVar7 + 0x68) = pvVar15;
            if (pvVar15 != (void *)0x0) {
              if (uVar3 != 0) {
                uVar25 = 0;
                uVar27 = 0xffffffff;
                do {
                  puVar30 = (uint *)(uVar25 * 0x30 + *(long *)((long)pvVar7 + 0x68));
                  puVar16 = (uint *)__archive_read_ahead(a,0x10,(ssize_t *)0x0);
                  if (puVar16 == (uint *)0x0) goto LAB_00119032;
                  *puVar30 = *puVar16;
                  puVar30[1] = puVar16[1];
                  *(short *)(puVar30 + 4) = (short)puVar16[2];
                  tVar17 = cab_dos_time((uchar *)((long)puVar16 + 10));
                  *(time_t *)(puVar30 + 2) = tVar17;
                  *(undefined1 *)((long)puVar30 + 0x12) = *(undefined1 *)((long)puVar16 + 0xe);
                  __archive_read_consume(a,0x10);
                  *(long *)((long)pvVar7 + 0x40) = *(long *)((long)pvVar7 + 0x40) + 0x10;
                  sVar32 = 0x100;
                  do {
                    pvVar15 = __archive_read_ahead(a,sVar32,&local_38);
                    if (pvVar15 != (void *)0x0) break;
                    bVar20 = sVar32 != 1;
                    sVar32 = sVar32 - 1;
                  } while (bVar20);
                  if (pvVar15 == (void *)0x0) goto LAB_00119032;
                  uVar19 = 1;
                  while (*(char *)((long)pvVar15 + (uVar19 - 1)) != '\0') {
                    bVar20 = local_38 - 1U < uVar19;
                    uVar19 = uVar19 + 1;
                    if (bVar20) goto LAB_001190b1;
                  }
                  if ((long)(uVar19 - 1) < 1) goto LAB_001190b1;
                  puVar30[6] = 0;
                  puVar30[7] = 0;
                  puVar30[8] = 0;
                  puVar30[9] = 0;
                  puVar30[10] = 0;
                  puVar30[0xb] = 0;
                  archive_strncat((archive_string *)(puVar30 + 6),pvVar15,uVar19 - 1);
                  __archive_read_consume(a,uVar19);
                  *(long *)((long)pvVar7 + 0x40) = *(long *)((long)pvVar7 + 0x40) + uVar19;
                  uVar19 = (ulong)*puVar30;
                  if ((0x7fff8000 < uVar19) || (uVar28 = puVar30[1], 0x7fff8000 < uVar28 + uVar19))
                  goto LAB_001190b1;
                  uVar3 = (ushort)puVar30[4];
                  uVar21 = (uint)uVar3;
                  if (uVar3 == 0xfffd) {
                    if (uVar25 != 0) goto LAB_001190b1;
LAB_00118f72:
                    uVar27 = 0;
                    uVar21 = 0;
                    uVar11 = uVar28;
                  }
                  else {
                    if (uVar3 == 0xffff) {
                      if ((uVar25 == 0) && (*(short *)((long)pvVar7 + 0x52) == 1))
                      goto LAB_00118f72;
                      goto LAB_001190b1;
                    }
                    if (uVar3 == 0xfffe) {
                      if (uVar25 != *(ushort *)((long)pvVar7 + 0x52) - 1) goto LAB_001190b1;
                      uVar21 = *(ushort *)((long)pvVar7 + 0x50) - 1;
                    }
                    else if (*(ushort *)((long)pvVar7 + 0x50) <= uVar3) goto LAB_001190b1;
                    if ((int)uVar21 < (int)uVar27) goto LAB_001190b1;
                  }
                  if (uVar21 != uVar27) {
                    uVar11 = 0;
                  }
                  if ((uVar11 != uVar28) ||
                     ((uVar19 != 0 &&
                      (*(short *)(*(long *)((long)pvVar7 + 0x60) + 4 + (long)(int)uVar21 * 0x60) ==
                       0)))) goto LAB_001190b1;
                  uVar11 = uVar28 + *puVar30;
                  uVar25 = uVar25 + 1;
                  uVar27 = uVar21;
                } while (uVar25 < *(ushort *)((long)pvVar7 + 0x52));
              }
              if ((*(short *)((long)pvVar7 + 0x58) == 0) &&
                 ((*(byte *)((long)pvVar7 + 0x54) & 3) == 0)) {
                wVar9 = L'\0';
              }
              else {
                archive_set_error(&a->archive,0x54,"Multivolume cabinet file is unsupported");
                wVar9 = L'\xffffffec';
              }
              *(undefined1 *)(puVar6 + 0x12) = 1;
              goto LAB_00118615;
            }
          }
          pcVar22 = "Can\'t allocate memory for CAB data";
          goto LAB_001188af;
        }
        pvVar15 = __archive_read_ahead(a,lVar29 + 0x100,(ssize_t *)0x0);
        if (pvVar15 != (void *)0x0) {
          lVar18 = 0;
          do {
            if (*(char *)((long)pvVar15 + lVar18 + lVar29) == '\0') {
              if (lVar18 != 0) {
                pvVar15 = __archive_read_ahead(a,lVar29 + lVar18 + 0x101,(ssize_t *)0x0);
                if (pvVar15 == (void *)0x0) goto LAB_00118d45;
                lVar33 = (-2 - lVar29) - lVar18;
                lVar26 = 0;
                goto LAB_00118d22;
              }
              break;
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 != 0x100);
          goto LAB_001190b1;
        }
      }
      else {
        pvVar15 = __archive_read_ahead(a,lVar29 + 0x100,(ssize_t *)0x0);
        if (pvVar15 != (void *)0x0) {
          lVar18 = 0;
          do {
            if (*(char *)((long)pvVar15 + lVar18 + lVar29) == '\0') {
              if (lVar18 != 0) {
                pvVar15 = __archive_read_ahead(a,lVar29 + lVar18 + 0x101,(ssize_t *)0x0);
                if (pvVar15 == (void *)0x0) goto LAB_00118d45;
                lVar33 = (-2 - lVar29) - lVar18;
                lVar26 = 0;
                goto LAB_00118ccf;
              }
              break;
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 != 0x100);
          goto LAB_001190b1;
        }
      }
LAB_00119032:
      pcVar22 = "Truncated CAB header";
      goto LAB_0011903c;
    }
  }
  pcVar22 = "Couldn\'t find out CAB header";
  goto LAB_0011903c;
  while( true ) {
    lVar26 = lVar26 + 1;
    lVar33 = lVar33 + -1;
    if (lVar26 == 0x100) break;
LAB_00118ccf:
    if (*(char *)((long)pvVar15 + lVar18 + lVar26 + lVar29 + 1) == '\0') {
      if (lVar26 != 0) {
        lVar29 = -lVar33;
        uVar3 = *(ushort *)((long)pvVar7 + 0x54);
        goto LAB_00118aeb;
      }
      break;
    }
  }
  goto LAB_001190b1;
LAB_00118d45:
  pcVar22 = "Truncated CAB header";
  goto LAB_0011903c;
  while( true ) {
    lVar26 = lVar26 + 1;
    lVar33 = lVar33 + -1;
    if (lVar26 == 0x100) break;
LAB_00118d22:
    if (*(char *)((long)pvVar15 + lVar18 + lVar26 + lVar29 + 1) == '\0') {
      if (lVar26 != 0) {
        lVar29 = -lVar33;
        goto LAB_00118af7;
      }
      break;
    }
  }
LAB_001190b1:
  pcVar22 = "Invalid CAB header";
LAB_0011903c:
  iVar23 = 0x54;
LAB_00119041:
  archive_set_error(&a->archive,iVar23,pcVar22);
  return L'\xffffffe2';
}

Assistant:

static int
cab_read_header(struct archive_read *a)
{
	const unsigned char *p;
	struct cab *cab;
	struct cfheader *hd;
	size_t bytes, used;
	ssize_t len;
	int64_t skip;
	int err, i;
	int cur_folder, prev_folder;
	uint32_t offset32;
	
	a->archive.archive_format = ARCHIVE_FORMAT_CAB;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "CAB";

	if ((p = __archive_read_ahead(a, 42, NULL)) == NULL)
		return (truncated_error(a));

	cab = (struct cab *)(a->format->data);
	if (cab->found_header == 0 &&
	    p[0] == 'M' && p[1] == 'Z') {
		/* This is an executable?  Must be self-extracting... */
		err = cab_skip_sfx(a);
		if (err < ARCHIVE_WARN)
			return (err);

		/* Re-read header after processing the SFX. */
		if ((p = __archive_read_ahead(a, 42, NULL)) == NULL)
			return (truncated_error(a));
	}

	cab->cab_offset = 0;
	/*
	 * Read CFHEADER.
	 */
	hd = &cab->cfheader;
	if (p[CFHEADER_signature+0] != 'M' || p[CFHEADER_signature+1] != 'S' ||
	    p[CFHEADER_signature+2] != 'C' || p[CFHEADER_signature+3] != 'F') {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Couldn't find out CAB header");
		return (ARCHIVE_FATAL);
	}
	hd->total_bytes = archive_le32dec(p + CFHEADER_cbCabinet);
	hd->files_offset = archive_le32dec(p + CFHEADER_coffFiles);
	hd->minor = p[CFHEADER_versionMinor];
	hd->major = p[CFHEADER_versionMajor];
	hd->folder_count = archive_le16dec(p + CFHEADER_cFolders);
	if (hd->folder_count == 0)
		goto invalid;
	hd->file_count = archive_le16dec(p + CFHEADER_cFiles);
	if (hd->file_count == 0)
		goto invalid;
	hd->flags = archive_le16dec(p + CFHEADER_flags);
	hd->setid = archive_le16dec(p + CFHEADER_setID);
	hd->cabinet = archive_le16dec(p + CFHEADER_iCabinet);
	used = CFHEADER_iCabinet + 2;
	if (hd->flags & RESERVE_PRESENT) {
		uint16_t cfheader;
		cfheader = archive_le16dec(p + CFHEADER_cbCFHeader);
		if (cfheader > 60000U)
			goto invalid;
		hd->cffolder = p[CFHEADER_cbCFFolder];
		hd->cfdata = p[CFHEADER_cbCFData];
		used += 4;/* cbCFHeader, cbCFFolder and cbCFData */
		used += cfheader;/* abReserve */
	} else
		hd->cffolder = 0;/* Avoid compiling warning. */
	if (hd->flags & PREV_CABINET) {
		/* How many bytes are used for szCabinetPrev. */
		if ((p = __archive_read_ahead(a, used+256, NULL)) == NULL)
			return (truncated_error(a));
		if ((len = cab_strnlen(p + used, 255)) <= 0)
			goto invalid;
		used += len + 1;
		/* How many bytes are used for szDiskPrev. */
		if ((p = __archive_read_ahead(a, used+256, NULL)) == NULL)
			return (truncated_error(a));
		if ((len = cab_strnlen(p + used, 255)) <= 0)
			goto invalid;
		used += len + 1;
	}
	if (hd->flags & NEXT_CABINET) {
		/* How many bytes are used for szCabinetNext. */
		if ((p = __archive_read_ahead(a, used+256, NULL)) == NULL)
			return (truncated_error(a));
		if ((len = cab_strnlen(p + used, 255)) <= 0)
			goto invalid;
		used += len + 1;
		/* How many bytes are used for szDiskNext. */
		if ((p = __archive_read_ahead(a, used+256, NULL)) == NULL)
			return (truncated_error(a));
		if ((len = cab_strnlen(p + used, 255)) <= 0)
			goto invalid;
		used += len + 1;
	}
	__archive_read_consume(a, used);
	cab->cab_offset += used;
	used = 0;

	/*
	 * Read CFFOLDER.
	 */
	hd->folder_array = calloc(
	    hd->folder_count, sizeof(struct cffolder));
	if (hd->folder_array == NULL)
		goto nomem;
	
	bytes = 8;
	if (hd->flags & RESERVE_PRESENT)
		bytes += hd->cffolder;
	bytes *= hd->folder_count;
	if ((p = __archive_read_ahead(a, bytes, NULL)) == NULL)
		return (truncated_error(a));
	offset32 = 0;
	for (i = 0; i < hd->folder_count; i++) {
		struct cffolder *folder = &(hd->folder_array[i]);
		folder->cfdata_offset_in_cab =
		    archive_le32dec(p + CFFOLDER_coffCabStart);
		folder->cfdata_count = archive_le16dec(p+CFFOLDER_cCFData);
		folder->comptype =
		    archive_le16dec(p+CFFOLDER_typeCompress) & 0x0F;
		folder->compdata =
		    archive_le16dec(p+CFFOLDER_typeCompress) >> 8;
		/* Get a compression name. */
		if (folder->comptype <
		    sizeof(compression_name) / sizeof(compression_name[0]))
			folder->compname = compression_name[folder->comptype];
		else
			folder->compname = "UNKNOWN";
		p += 8;
		used += 8;
		if (hd->flags & RESERVE_PRESENT) {
			p += hd->cffolder;/* abReserve */
			used += hd->cffolder;
		}
		/*
		 * Sanity check if each data is acceptable.
		 */
		if (offset32 >= folder->cfdata_offset_in_cab)
			goto invalid;
		offset32 = folder->cfdata_offset_in_cab;

		/* Set a request to initialize zlib for the CFDATA of
		 * this folder. */
		folder->decompress_init = 0;
	}
	__archive_read_consume(a, used);
	cab->cab_offset += used;

	/*
	 * Read CFFILE.
	 */
	/* Seek read pointer to the offset of CFFILE if needed. */
	skip = (int64_t)hd->files_offset - cab->cab_offset;
	if (skip <  0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Invalid offset of CFFILE %jd < %jd",
		    (intmax_t)hd->files_offset, (intmax_t)cab->cab_offset);
		return (ARCHIVE_FATAL);
	}
	if (skip) {
		__archive_read_consume(a, skip);
		cab->cab_offset += skip;
	}
	/* Allocate memory for CFDATA */
	hd->file_array = calloc(
	    hd->file_count, sizeof(struct cffile));
	if (hd->file_array == NULL)
		goto nomem;

	prev_folder = -1;
	for (i = 0; i < hd->file_count; i++) {
		struct cffile *file = &(hd->file_array[i]);
		ssize_t avail;

		if ((p = __archive_read_ahead(a, 16, NULL)) == NULL)
			return (truncated_error(a));
		file->uncompressed_size = archive_le32dec(p + CFFILE_cbFile);
		file->offset = archive_le32dec(p + CFFILE_uoffFolderStart);
		file->folder = archive_le16dec(p + CFFILE_iFolder);
		file->mtime = cab_dos_time(p + CFFILE_date_time);
		file->attr = (uint8_t)archive_le16dec(p + CFFILE_attribs);
		__archive_read_consume(a, 16);

		cab->cab_offset += 16;
		if ((p = cab_read_ahead_remaining(a, 256, &avail)) == NULL)
			return (truncated_error(a));
		if ((len = cab_strnlen(p, avail-1)) <= 0)
			goto invalid;

		/* Copy a pathname.  */
		archive_string_init(&(file->pathname));
		archive_strncpy(&(file->pathname), p, len);
		__archive_read_consume(a, len + 1);
		cab->cab_offset += len + 1;

		/*
		 * Sanity check if each data is acceptable.
		 */
		if (file->uncompressed_size > 0x7FFF8000)
			goto invalid;/* Too large */
		if ((int64_t)file->offset + (int64_t)file->uncompressed_size
		    > ARCHIVE_LITERAL_LL(0x7FFF8000))
			goto invalid;/* Too large */
		switch (file->folder) {
		case iFoldCONTINUED_TO_NEXT:
			/* This must be last file in a folder. */
			if (i != hd->file_count -1)
				goto invalid;
			cur_folder = hd->folder_count -1;
			break;
		case iFoldCONTINUED_PREV_AND_NEXT:
			/* This must be only one file in a folder. */
			if (hd->file_count != 1)
				goto invalid;
			/* FALL THROUGH */
		case iFoldCONTINUED_FROM_PREV:
			/* This must be first file in a folder. */
			if (i != 0)
				goto invalid;
			prev_folder = cur_folder = 0;
			offset32 = file->offset;
			break;
		default:
			if (file->folder >= hd->folder_count)
				goto invalid;
			cur_folder = file->folder;
			break;
		}
		/* Dot not back track. */
		if (cur_folder < prev_folder)
			goto invalid;
		if (cur_folder != prev_folder)
			offset32 = 0;
		prev_folder = cur_folder;

		/* Make sure there are not any blanks from last file
		 * contents. */
		if (offset32 != file->offset)
			goto invalid;
		offset32 += file->uncompressed_size;

		/* CFDATA is available for file contents. */
		if (file->uncompressed_size > 0 &&
		    hd->folder_array[cur_folder].cfdata_count == 0)
			goto invalid;
	}

	if (hd->cabinet != 0 || hd->flags & (PREV_CABINET | NEXT_CABINET)) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Multivolume cabinet file is unsupported");
		return (ARCHIVE_WARN);
	}
	return (ARCHIVE_OK);
invalid:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "Invalid CAB header");
	return (ARCHIVE_FATAL);
nomem:
	archive_set_error(&a->archive, ENOMEM,
	    "Can't allocate memory for CAB data");
	return (ARCHIVE_FATAL);
}